

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall BpTree<int>::InsertKey(BpTree<int> *this,int k,Addr p)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  IndexNode<int> *pIVar7;
  Addr Cp;
  IndexNode<int> B;
  IndexNode<int> T;
  IndexNode<int> D;
  IndexNode<int> A;
  IndexNode<int> local_138;
  IndexNode<int> local_d8;
  IndexNode<int> local_78;
  
  IndexNode<int>::IndexNode(&local_138,this->N);
  if ((this->RootAddr).FileOff == -1) {
    local_138.NodeState = '1';
    local_138.parent.BlockNum = -1;
    local_138.parent.FileOff = -1;
    *local_138.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_start = '1';
    *local_138.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = k;
    *local_138.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
     _M_start = p;
    InsertNode(this,&local_138);
    this->RootAddr = local_138.self;
    IndexNode<int>::IndexNode(&local_78,&local_138);
    UpdateBlock(this,&local_78);
    pIVar7 = &local_78;
  }
  else {
    FindFirstKey(this,k,&Cp);
    IndexNode<int>::IndexNode(&A,this->N);
    FindNode(this,Cp,&A);
    if (A.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [(long)this->N + -2] == '0') {
      Insert_Leaf(this,&A,k,p);
      IndexNode<int>::IndexNode(&local_d8,&A);
      UpdateBlock(this,&local_d8);
      pIVar7 = &local_d8;
    }
    else {
      InsertNode(this,&local_138);
      IndexNode<int>::IndexNode(&B,this->N);
      IndexNode<int>::IndexNode(&D,this->N);
      FindNode(this,Cp,&B);
      FindNode(this,local_138.self,&D);
      IndexNode<int>::IndexNode(&T,&B);
      Insert_Leaf(this,&T,k,p);
      for (lVar2 = 0; uVar5 = (ulong)this->N, lVar2 < (long)(uVar5 - 1); lVar2 = lVar2 + 1) {
        B.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar2].BlockNum = -1;
        B.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar2].FileOff = -1;
        B.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [lVar2] = '0';
      }
      lVar2 = 0;
      while( true ) {
        iVar4 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / 2);
        if ((int)((uint)(iVar4 * 2 < (int)uVar5) + iVar4) <= lVar2) break;
        B.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [lVar2] = T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar2];
        B.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar2] = T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar2];
        B.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [lVar2] = '1';
        lVar2 = lVar2 + 1;
        uVar5 = (ulong)(uint)this->N;
      }
      while( true ) {
        iVar4 = (int)uVar5;
        lVar3 = (long)iVar4;
        if (lVar3 <= lVar2) break;
        iVar1 = (int)((long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / 2);
        iVar6 = (int)lVar2;
        D.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
        [(int)(iVar6 - ((uint)(iVar1 * 2 < iVar4) + iVar1))] =
             T.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar2];
        iVar4 = this->N / 2;
        D.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [(int)(iVar6 - ((uint)(iVar4 * 2 < this->N) + iVar4))] =
             T.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar2];
        iVar4 = this->N / 2;
        D.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [(int)(iVar6 - ((uint)(iVar4 * 2 < this->N) + iVar4))] = '1';
        lVar2 = lVar2 + 1;
        uVar5 = (ulong)(uint)this->N;
      }
      D.NodeState = '1';
      D.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [lVar3 + -1] = B.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar3 + -1];
      B.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
      [lVar3 + -1] = D.self;
      Insert_Parent(this,&B,*D.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,&D);
      IndexNode<int>::~IndexNode(&T);
      IndexNode<int>::~IndexNode(&D);
      pIVar7 = &B;
    }
    IndexNode<int>::~IndexNode(pIVar7);
    pIVar7 = &A;
  }
  IndexNode<int>::~IndexNode(pIVar7);
  IndexNode<int>::~IndexNode(&local_138);
  return;
}

Assistant:

void BpTree<K>::InsertKey(K k, Addr p) {
	int i;
	IndexNode<K> C(N);
	if (this->RootAddr.FileOff == -1) {
		C.NodeState = LEAF;		//����
		C.parent = { -1, -1 };
		C.v[0] = '1';		C.k[0] = k;		C.p[0] = p;
		this->InsertNode(C);
		this->RootAddr = C.self;
		this->UpdateBlock(C);
		return;
	}
	Addr Cp;
	int temp = this->FindFirstKey(k, Cp);	//���ǿ���
	IndexNode<K> A(N);
	this->FindNode(Cp, A);
	if (A.v[N-2] == '0') {
		this->Insert_Leaf(A, k, p);		//�п�
		this->UpdateBlock(A);
		return;
	}
	this->InsertNode(C);				//������ˣ�����½��
	IndexNode<K> B(N);
	IndexNode<K> D(N);
	this->FindNode(Cp, B);
	this->FindNode(C.self, D);
	IndexNode<K> T = B;
	this->Insert_Leaf(T, k, p);
	for (i = 0; i < N - 1; i++) {
		B.p[i] = { -1, -1 };			//���B.p[0]��B.p[N - 2]
		B.v[i] = '0';					//���B.v[0]��B.v[N - 2]
	}
	for (i = 0; i < MIN_POINTS_NONLEAF; i++) {		//���¾ɽ��
		B.p[i] = T.p[i];
		B.k[i] = T.k[i];
		B.v[i] = '1';
	}
	for (; i < N; i++) {							//�����½��
		D.p[i - MIN_POINTS_NONLEAF] = T.p[i];
		D.k[i - MIN_POINTS_NONLEAF] = T.k[i];
		D.v[i - MIN_POINTS_NONLEAF] = '1';
	}
	D.NodeState = LEAF;
	D.p[N - 1].BlockNum = B.p[N - 1].BlockNum;	//�½�����ָ���������ϣ����Բ���ԭ������
	D.p[N - 1].FileOff = B.p[N - 1].FileOff;
	
	B.p[N - 1] = D.self;		//�ɽڵ���������������
	K k2 = D.k[0];
	Insert_Parent(B, k2, D);
}